

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::SharedDepthbufferTest::render
          (SharedDepthbufferTest *this,Context *context,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  Vector<float,_3> local_400;
  Vector<float,_3> local_3f4;
  Vector<float,_3> local_3e8;
  Vector<float,_3> local_3dc;
  Vector<float,_3> local_3d0;
  Vector<float,_3> local_3c4;
  Vector<float,_3> local_3b8;
  Vector<float,_3> local_3ac;
  Vector<float,_3> local_3a0;
  Vector<float,_3> local_394;
  undefined1 local_388 [8];
  Framebuffer fboB;
  FboConfig cfg;
  undefined1 local_338 [8];
  Framebuffer fboA;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  byte local_2ed;
  uint local_2ec;
  uint uStack_2e8;
  bool stencil;
  int height;
  int width;
  deUint32 colorShaderID;
  deUint32 texShaderID;
  undefined1 local_2d0 [8];
  FlatColorShader colorShader;
  SingleTex2DShader texShader;
  Surface *dst_local;
  Context *context_local;
  SharedDepthbufferTest *this_local;
  
  SingleTex2DShader::SingleTex2DShader
            ((SingleTex2DShader *)&colorShader.super_ShaderProgram.m_hasGeometryShader);
  FlatColorShader::FlatColorShader((FlatColorShader *)local_2d0);
  width = (*context->_vptr_Context[0x75])
                    (context,&colorShader.super_ShaderProgram.m_hasGeometryShader);
  height = (*context->_vptr_Context[0x75])(context,local_2d0);
  uStack_2e8 = 0x80;
  local_2ec = 0x80;
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  local_2ed = pFVar5->stencilbufferType != 0;
  SingleTex2DShader::setUnit
            ((SingleTex2DShader *)&colorShader.super_ShaderProgram.m_hasGeometryShader,context,width
             ,0);
  iVar1 = height;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&quadsTex,0.0,1.0,0.0,1.0);
  FlatColorShader::setColor((FlatColorShader *)local_2d0,context,iVar1,(Vec4 *)&quadsTex);
  fboA.m_stencilbuffer = 5;
  fboA.m_depthbuffer = 6;
  createMetaballsTex2D(context,5,0x1907,0x1401,0x40,0x40);
  createQuadsTex2D(context,fboA.m_depthbuffer,0x1907,0x1401,0x40,0x40);
  (*context->_vptr_Context[5])(context,0,0,(ulong)uStack_2e8,(ulong)local_2ec);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Framebuffer::Framebuffer((Framebuffer *)local_338,context,pFVar5,uStack_2e8,local_2ec,0,0,0,0);
  Framebuffer::checkCompleteness((Framebuffer *)local_338);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  fboB.m_depthbuffer = pFVar5->colorbufferType;
  fboB.m_stencilbuffer = pFVar5->colorbufferFormat;
  Framebuffer::Framebuffer
            ((Framebuffer *)local_388,context,(FboConfig *)&fboB.m_depthbuffer,uStack_2e8,local_2ec,
             0,0,0,0);
  dVar2 = Framebuffer::getFramebuffer((Framebuffer *)local_388);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  dVar2 = Framebuffer::getDepthbuffer((Framebuffer *)local_338);
  (*context->_vptr_Context[0x20])(context,0x8d40,0x8d00,0x8d41,(ulong)dVar2);
  (*context->_vptr_Context[0x2a])(0x3f800000,0);
  (*context->_vptr_Context[0x2c])(context,1);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xb71);
  dVar2 = Framebuffer::getFramebuffer((Framebuffer *)local_338);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_depthbuffer);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  iVar1 = width;
  tcu::Vector<float,_3>::Vector(&local_394,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_3a0,1.0,1.0,0.0);
  sglr::drawQuad(context,iVar1,&local_394,&local_3a0);
  dVar2 = Framebuffer::getFramebuffer((Framebuffer *)local_388);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_stencilbuffer);
  iVar1 = width;
  tcu::Vector<float,_3>::Vector(&local_3ac,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_3b8,1.0,1.0,1.0);
  sglr::drawQuad(context,iVar1,&local_3ac,&local_3b8);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((local_2ed & 1) != 0) {
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,0);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,0,0xff);
    iVar1 = height;
    tcu::Vector<float,_3>::Vector(&local_3c4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_3d0,1.0,1.0,0.0);
    sglr::drawQuad(context,iVar1,&local_3c4,&local_3d0);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  if (pFVar5->colorbufferType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
    dVar2 = Framebuffer::getColorbuffer((Framebuffer *)local_338);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    iVar1 = width;
    tcu::Vector<float,_3>::Vector(&local_3dc,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_3e8,0.0,1.0,0.0);
    sglr::drawQuad(context,iVar1,&local_3dc,&local_3e8);
    dVar2 = Framebuffer::getColorbuffer((Framebuffer *)local_388);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    iVar1 = width;
    tcu::Vector<float,_3>::Vector(&local_3f4,0.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_400,1.0,1.0,0.0);
    sglr::drawQuad(context,iVar1,&local_3f4,&local_400);
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  else {
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uStack_2e8,(ulong)local_2ec);
  }
  Framebuffer::~Framebuffer((Framebuffer *)local_388);
  Framebuffer::~Framebuffer((Framebuffer *)local_338);
  FlatColorShader::~FlatColorShader((FlatColorShader *)local_2d0);
  SingleTex2DShader::~SingleTex2DShader
            ((SingleTex2DShader *)&colorShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void SharedDepthbufferTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	texShader;
	FlatColorShader		colorShader;
	deUint32			texShaderID		= context.createProgram(&texShader);
	deUint32			colorShaderID	= context.createProgram(&colorShader);
	int					width			= 128;
	int					height			= 128;
	bool				stencil			= getConfig().stencilbufferType != GL_NONE;

	// Setup shaders
	texShader.setUnit(context, texShaderID, 0);
	colorShader.setColor(context, colorShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Textures
	deUint32 metaballsTex	= 5;
	deUint32 quadsTex		= 6;
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, getConfig(), width, height);
	fboA.checkCompleteness();

	// Fbo B
	FboConfig cfg = getConfig();
	cfg.depthbufferType		= GL_NONE;
	cfg.depthbufferFormat	= GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Bind depth buffer from fbo A to fbo B
	DE_ASSERT(fboA.getConfig().depthbufferType == GL_RENDERBUFFER);
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fboA.getDepthbuffer());

	// Clear fbo B color to red and stencil to 1
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clearStencil(1);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Enable depth test.
	context.enable(GL_DEPTH_TEST);

	// Render quad to fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render metaballs to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		// Clear subset of stencil buffer to 0
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(0);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 0
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 0, 0xffu);
		sglr::drawQuad(context, colorShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Render both to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));
		context.bindTexture(GL_TEXTURE_2D, fboB.getColorbuffer());
		sglr::drawQuad(context, texShaderID, Vec3(0.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read results from fbo B
		context.readPixels(dst, 0, 0, width, height);
	}
}